

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O0

bool __thiscall axl::cry::X509Cert::loadPem(X509Cert *this,void *p,size_t size)

{
  BIO *bp;
  X509 *pXVar1;
  int in_ESI;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *in_RDI;
  X509 *result;
  X509 *cert;
  Bio bio;
  x509_st *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  void *in_stack_ffffffffffffff88;
  Bio *in_stack_ffffffffffffff90;
  X509 *local_40 [3];
  Handle local_28 [39];
  bool local_1;
  
  sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::close(in_RDI,in_ESI);
  Bio::Bio((Bio *)0x1515a4);
  Bio::createMemBuf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  local_40[0] = X509_new();
  bp = (BIO *)sl::Handle::operator_cast_to_bio_st_(local_28);
  pXVar1 = PEM_read_bio_X509(bp,local_40,(undefined1 *)0x0,(void *)0x0);
  if (pXVar1 == (X509 *)0x0) {
    local_1 = failWithLastCryptoError();
  }
  else {
    sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::attach
              ((Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_1 = true;
  }
  Bio::~Bio((Bio *)0x151677);
  return (bool)(local_1 & 1);
}

Assistant:

bool
X509Cert::loadPem(
	const void* p,
	size_t size
) {
	close();

	Bio bio;
	bio.createMemBuf(p, size);

	X509* cert = X509_new();
	X509* result = PEM_read_bio_X509(bio, &cert, NULL, NULL);
	if (!result) {
		ASSERT(cert == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(cert);
	return true;
}